

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_FieldNamesDedupOnOptimizedCases_Test::TestBody
::anon_class_1_0_00000001::operator()
          (btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *__return_storage_ptr__,anon_class_1_0_00000001 *this,FieldDescriptor *field)

{
  initializer_list<const_char_*> iVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> iVar2;
  bool bVar3;
  Message *message;
  char *message_00;
  btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *value;
  AssertHelper local_178;
  string local_170;
  Message local_150;
  allocator<const_void_*> local_143;
  key_equal local_142;
  hasher local_141;
  string_view local_140;
  string_view local_130;
  string_view local_120;
  string_view local_110;
  const_pointer local_100;
  const_pointer local_f8;
  const_pointer local_f0;
  const_pointer local_e8;
  iterator local_e0;
  size_type local_d8;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_void_*>,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>
  local_d0;
  size_t local_b0;
  size_type local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_7a;
  key_compare local_79;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  string_view local_48;
  iterator local_38;
  size_type local_30;
  undefined1 local_21;
  FieldDescriptor *local_20;
  FieldDescriptor *field_local;
  anon_class_1_0_00000001 *this_local;
  btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *names;
  
  local_21 = 0;
  local_20 = field;
  field_local = (FieldDescriptor *)this;
  this_local = (anon_class_1_0_00000001 *)__return_storage_ptr__;
  local_78 = FieldDescriptor::name(field);
  local_68 = FieldDescriptor::lowercase_name(local_20);
  local_58 = FieldDescriptor::camelcase_name(local_20);
  local_48 = FieldDescriptor::json_name(local_20);
  local_38 = &local_78;
  local_30 = 4;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_7a);
  iVar2._M_len = local_30;
  iVar2._M_array = local_38;
  absl::lts_20250127::
  btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::btree_set_container(__return_storage_ptr__,iVar2,&local_79,&local_7a);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_7a);
  local_a8 = absl::lts_20250127::container_internal::
             btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>_>
             ::size((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>_>
                     *)__return_storage_ptr__);
  local_110 = FieldDescriptor::name(local_20);
  local_100 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_110);
  local_120 = FieldDescriptor::lowercase_name(local_20);
  local_f8 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_120);
  local_130 = FieldDescriptor::camelcase_name(local_20);
  local_f0 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_130);
  local_140 = FieldDescriptor::json_name(local_20);
  local_e8 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_140);
  local_e0 = &local_100;
  local_d8 = 4;
  std::allocator<const_void_*>::allocator(&local_143);
  iVar1._M_len = local_d8;
  iVar1._M_array = local_e0;
  absl::lts_20250127::
  flat_hash_set<const_void_*,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>
  ::raw_hash_set((flat_hash_set<const_void_*,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>
                  *)&local_d0,iVar1,0,&local_141,&local_142,&local_143);
  local_b0 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_void_*>,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>
             ::size(&local_d0);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_a0,"names.size()",
             "(absl::flat_hash_set<const void*>{ field->name().data(), field->lowercase_name().data(), field->camelcase_name().data(), field->json_name().data()} .size())"
             ,&local_a8,&local_b0);
  absl::lts_20250127::
  flat_hash_set<const_void_*,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>
  ::~flat_hash_set((flat_hash_set<const_void_*,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>
                    *)&local_d0);
  std::allocator<const_void_*>::~allocator(&local_143);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar3) {
    testing::Message::Message(&local_150);
    testing::
    PrintToString<absl::lts_20250127::btree_set<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
              (&local_170,(testing *)__return_storage_ptr__,value);
    message = testing::Message::operator<<(&local_150,&local_170);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3c8,message_00);
    testing::internal::AssertHelper::operator=(&local_178,message);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    std::__cxx11::string::~string((string *)&local_170);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

TEST_F(DescriptorTest, FieldNamesDedupOnOptimizedCases) {
  const auto collect_unique_names = [](const FieldDescriptor* field) {
    absl::btree_set<absl::string_view> names{
        field->name(), field->lowercase_name(), field->camelcase_name(),
        field->json_name()};
    // For names following the style guide, verify that we have the same number
    // of string objects as we have string values. That is, duplicate names use
    // the same std::string object. This is for memory efficiency.
    EXPECT_EQ(names.size(),
              (absl::flat_hash_set<const void*>{
                  field->name().data(), field->lowercase_name().data(),
                  field->camelcase_name().data(), field->json_name().data()}
                   .size()))
        << testing::PrintToString(names);
    return names;
  };

  // field_name1
  EXPECT_THAT(collect_unique_names(message4_->field(0)),
              ElementsAre("fieldName1", "field_name1"));
  // fieldname7
  EXPECT_THAT(collect_unique_names(message4_->field(6)),
              ElementsAre("fieldname7"));
}